

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O2

void FAudio_INTERNAL_Mix_Generic_Scalar
               (uint32_t toMix,uint32_t srcChans,uint32_t dstChans,float *src,float *dst,
               float *coefficients)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar1 = (ulong)srcChans;
  for (uVar3 = 0; uVar3 != toMix; uVar3 = uVar3 + 1) {
    lVar4 = 0;
    for (uVar2 = 0; uVar2 != dstChans; uVar2 = uVar2 + 1) {
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        dst[uVar2] = src[uVar5] * coefficients[(uint)((int)lVar4 + (int)uVar5)] + dst[uVar2];
      }
      lVar4 = lVar4 + uVar1;
    }
    dst = dst + dstChans;
    src = src + uVar1;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_Generic_Scalar(
	uint32_t toMix,
	uint32_t srcChans,
	uint32_t dstChans,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i, co, ci;
	for (i = 0; i < toMix; i += 1, src += srcChans, dst += dstChans)
	for (co = 0; co < dstChans; co += 1)
	{
		for (ci = 0; ci < srcChans; ci += 1)
		{
			dst[co] += (
				src[ci] *
				coefficients[co * srcChans + ci]
			);
		}
	}
}